

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tok.c
# Opt level: O0

void tokdefine(tokcxdef *ctx,char *p,int len)

{
  tokdfdef *ptVar1;
  ushort **ppuVar2;
  int in_EDX;
  long in_RSI;
  char mysym [39];
  char *expan;
  int symlen;
  char *sym;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  undefined4 in_stack_ffffffffffffffa0;
  undefined2 in_stack_ffffffffffffffa4;
  undefined1 in_stack_ffffffffffffffa6;
  undefined1 in_stack_ffffffffffffffa7;
  undefined1 uVar3;
  undefined4 in_stack_ffffffffffffffa8;
  int in_stack_ffffffffffffffac;
  undefined4 in_stack_ffffffffffffffb0;
  int in_stack_ffffffffffffffb4;
  tokcxdef *in_stack_ffffffffffffffb8;
  tokcxdef *in_stack_ffffffffffffffc0;
  tokcxdef *in_stack_ffffffffffffffc8;
  byte *local_30;
  int local_14;
  
  local_14 = tok_scan_defsym((tokcxdef *)
                             CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                             (char *)CONCAT17(in_stack_ffffffffffffffa7,
                                              CONCAT16(in_stack_ffffffffffffffa6,
                                                       CONCAT24(in_stack_ffffffffffffffa4,
                                                                in_stack_ffffffffffffffa0))),
                             in_stack_ffffffffffffff9c);
  if (local_14 != 0) {
    ptVar1 = tok_find_define(in_stack_ffffffffffffffb8,
                             (char *)CONCAT44(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffb0),
                             in_stack_ffffffffffffffac);
    if (ptVar1 == (tokdfdef *)0x0) {
      local_30 = (byte *)(in_RSI + local_14);
      local_14 = in_EDX - local_14;
      while( true ) {
        uVar3 = false;
        if ((local_14 != 0) &&
           (in_stack_ffffffffffffffa6 = false, uVar3 = in_stack_ffffffffffffffa6, *local_30 < 0x80))
        {
          ppuVar2 = __ctype_b_loc();
          in_stack_ffffffffffffffa6 = ((*ppuVar2)[(int)(uint)*local_30] & 0x2000) != 0;
          uVar3 = in_stack_ffffffffffffffa6;
        }
        if ((bool)uVar3 == false) break;
        local_14 = local_14 + -1;
        local_30 = local_30 + 1;
      }
      tok_casefold_defsym(in_stack_ffffffffffffffc8,(char *)in_stack_ffffffffffffffc0,
                          (char *)in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb4);
      tok_add_define(in_stack_ffffffffffffffc0,(char *)in_stack_ffffffffffffffb8,
                     in_stack_ffffffffffffffb4,
                     (char *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
                     CONCAT13(uVar3,CONCAT12(in_stack_ffffffffffffffa6,in_stack_ffffffffffffffa4)));
    }
    else {
      errlogf((errcxdef *)
              CONCAT17(in_stack_ffffffffffffffa7,
                       CONCAT16(in_stack_ffffffffffffffa6,
                                CONCAT24(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0))),
              (char *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),0);
    }
  }
  return;
}

Assistant:

static void tokdefine(tokcxdef *ctx, char *p, int len)
{
    char *sym;
    int   symlen;
    char *expan;
    char  mysym[TOKNAMMAX];
    
    /* get the symbol */
    sym = p;
    if (!(symlen = tok_scan_defsym(ctx, p, len)))
        return;

    /* if it's already in the table, log an error */
    if (tok_find_define(ctx, sym, symlen))
    {
        errlog(ctx->tokcxerr, ERR_DEFREDEF);
        return;
    }

    /* skip whitespace following the symbol */
    expan = sym + symlen;
    len -= symlen;
    while (len && t_isspace(*expan)) --len, ++expan;

    /* if we're folding case, convert the symbol to lower case */
    sym = tok_casefold_defsym(ctx, mysym, sym, symlen);

    /* define the symbol */
    tok_add_define(ctx, sym, symlen, expan, len);
}